

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O0

void Ntk_SymFunDeriveNpn(word *pFun,int nVars,int *pComp)

{
  int nWords_00;
  int iVar1;
  word *pOut;
  word *pFunB;
  int nWords;
  int i;
  int *pComp_local;
  int nVars_local;
  word *pFun_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  pOut = (word *)calloc((long)nWords_00,8);
  Abc_TtCopy(pOut,pFun,nWords_00,1);
  iVar1 = Abc_TtCompareRev(pOut,pFun,nWords_00);
  if (iVar1 == 1) {
    Abc_TtCopy(pOut,pFun,nWords_00,0);
  }
  for (pFunB._4_4_ = 0; pFunB._4_4_ < 1 << ((byte)nVars & 0x1f); pFunB._4_4_ = pFunB._4_4_ + 1) {
    Abc_TtFlip(pFun,nWords_00,pComp[pFunB._4_4_]);
    iVar1 = Abc_TtCompareRev(pOut,pFun,nWords_00);
    if (iVar1 == 1) {
      Abc_TtCopy(pOut,pFun,nWords_00,0);
    }
    Abc_TtNot(pFun,nWords_00);
    iVar1 = Abc_TtCompareRev(pOut,pFun,nWords_00);
    if (iVar1 == 1) {
      Abc_TtCopy(pOut,pFun,nWords_00,0);
    }
  }
  Abc_TtCopy(pFun,pOut,nWords_00,0);
  if (pOut != (word *)0x0) {
    free(pOut);
  }
  return;
}

Assistant:

void Ntk_SymFunDeriveNpn( word * pFun, int nVars, int * pComp )
{
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunB = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunB, pFun, nWords, 1 );
    if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
        Abc_TtCopy( pFunB, pFun, nWords, 0 );
    for ( i = 0; i < (1 << nVars); i++ )
    {
        Abc_TtFlip( pFun, nWords, pComp[i] );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
        Abc_TtNot( pFun, nWords );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
    }
    //Ntk_SymTryRandomFlips( pFun, pFunB, nVars );
    Abc_TtCopy( pFun, pFunB, nWords, 0 );
    ABC_FREE( pFunB );
}